

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  seqDef *psVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  ulong *puVar16;
  int iVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong *puVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong *puVar26;
  uint uVar27;
  BYTE *pBVar28;
  ulong uVar29;
  ulong uVar30;
  BYTE *pBVar31;
  ulong uVar32;
  uint uVar33;
  U32 UVar34;
  long lVar35;
  BYTE *pInLoopLimit;
  ulong local_e0;
  ulong local_d8;
  uint local_b4;
  ulong *local_40;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar26 = (ulong *)((long)src + (srcSize - 8));
  pBVar31 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar19 = (ulong *)((ulong)(pBVar31 == (BYTE *)src) + (long)src);
  uVar27 = (int)puVar19 - (int)pBVar31;
  uVar29 = (ulong)uVar5;
  if (uVar27 < uVar5) {
    uVar29 = 0;
  }
  local_b4 = (uint)uVar29;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar29 = (ulong)uVar6;
  if (uVar27 < uVar6) {
    uVar29 = 0;
  }
  uVar13 = (uint)uVar29;
  if (puVar19 < puVar26) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    do {
      uVar13 = (uint)uVar29;
      lVar35 = -uVar29;
      if (uVar13 == 0) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        if (*(int *)((long)puVar19 + 1) == *(int *)(((long)puVar19 + 1) - uVar29)) {
          puVar24 = (ulong *)((long)puVar19 + 5);
          puVar15 = (ulong *)((long)puVar19 + lVar35 + 5);
          puVar20 = puVar24;
          if (puVar24 < puVar1) {
            uVar23 = *puVar24 ^ *puVar15;
            uVar32 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
            if (*puVar15 == *puVar24) {
              puVar20 = (ulong *)((long)puVar19 + 0xd);
              puVar15 = (ulong *)((long)puVar19 + lVar35 + 0xd);
              do {
                if (puVar1 <= puVar20) goto LAB_00169287;
                uVar23 = *puVar15;
                uVar22 = *puVar20;
                uVar25 = uVar22 ^ uVar23;
                uVar32 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (long)puVar20 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar24);
                puVar20 = puVar20 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar23 == uVar22);
            }
          }
          else {
LAB_00169287:
            if ((puVar20 < puVar2) && ((int)*puVar15 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar20 < puVar3) && ((short)*puVar15 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar20 < puVar4) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar15 == (char)*puVar20));
            }
            uVar32 = (long)puVar20 - (long)puVar24;
          }
          uVar32 = uVar32 + 4;
        }
      }
      iVar17 = (int)puVar19;
      if (cParams->searchLength - 6 < 2) {
        pUVar8 = ms->chainTable;
        uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        uVar14 = (ms->window).lowLimit;
        uVar33 = iVar17 - (int)pBVar28;
        uVar12 = uVar33 - uVar21;
        if (uVar33 < uVar21) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar19,6);
        if (uVar11 <= uVar14) goto LAB_0016980b;
        iVar17 = 1 << ((byte)uVar7 & 0x1f);
        local_d8 = 99999999;
        uVar23 = 3;
        do {
          puVar24 = (ulong *)(pBVar28 + uVar11);
          if (*(char *)(uVar23 + (long)puVar24) == *(char *)((long)puVar19 + uVar23)) {
            puVar20 = puVar19;
            if (puVar19 < puVar1) {
              uVar25 = *puVar19 ^ *puVar24;
              uVar22 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar19) {
                do {
                  puVar20 = puVar20 + 1;
                  puVar24 = puVar24 + 1;
                  if (puVar1 <= puVar20) goto LAB_0016940b;
                  uVar25 = *puVar20 ^ *puVar24;
                  uVar22 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (long)puVar20 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar19);
                } while (*puVar24 == *puVar20);
              }
            }
            else {
LAB_0016940b:
              if ((puVar20 < puVar2) && ((int)*puVar24 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar24 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar20 < puVar4) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar24 == (char)*puVar20));
              }
              uVar22 = (long)puVar20 - (long)puVar19;
            }
          }
          else {
            uVar22 = 0;
          }
          if ((uVar23 < uVar22) &&
             (local_d8 = (ulong)((uVar33 + 2) - uVar11), uVar23 = uVar22,
             (ulong *)((long)puVar19 + uVar22) == puVar4)) {
            bVar10 = false;
          }
          else {
            uVar22 = uVar23;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar21 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar14 < uVar11)) &&
                (iVar17 = iVar17 + -1, uVar23 = uVar22, iVar17 != 0));
      }
      else if (cParams->searchLength == 5) {
        pUVar8 = ms->chainTable;
        uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        uVar14 = (ms->window).lowLimit;
        uVar33 = iVar17 - (int)pBVar28;
        uVar12 = uVar33 - uVar21;
        if (uVar33 < uVar21) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar19,5);
        if (uVar14 < uVar11) {
          iVar17 = 1 << ((byte)uVar7 & 0x1f);
          local_d8 = 99999999;
          uVar23 = 3;
          do {
            puVar24 = (ulong *)(pBVar28 + uVar11);
            if (*(char *)(uVar23 + (long)puVar24) == *(char *)((long)puVar19 + uVar23)) {
              puVar20 = puVar19;
              if (puVar19 < puVar1) {
                uVar25 = *puVar19 ^ *puVar24;
                uVar22 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
                if (*puVar24 == *puVar19) {
                  do {
                    puVar20 = puVar20 + 1;
                    puVar24 = puVar24 + 1;
                    if (puVar1 <= puVar20) goto LAB_001695c3;
                    uVar25 = *puVar20 ^ *puVar24;
                    uVar22 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = (long)puVar20 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar19);
                  } while (*puVar24 == *puVar20);
                }
              }
              else {
LAB_001695c3:
                if ((puVar20 < puVar2) && ((int)*puVar24 == (int)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar20 < puVar3) && ((short)*puVar24 == (short)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar20 < puVar4) {
                  puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar24 == (char)*puVar20));
                }
                uVar22 = (long)puVar20 - (long)puVar19;
              }
            }
            else {
              uVar22 = 0;
            }
            if ((uVar23 < uVar22) &&
               (local_d8 = (ulong)((uVar33 + 2) - uVar11), uVar23 = uVar22,
               (ulong *)((long)puVar19 + uVar22) == puVar4)) {
              bVar10 = false;
            }
            else {
              uVar22 = uVar23;
              if (uVar12 < uVar11) {
                uVar11 = pUVar8[uVar11 & uVar21 - 1];
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (((bVar10) && (uVar14 < uVar11)) &&
                  (iVar17 = iVar17 + -1, uVar23 = uVar22, iVar17 != 0));
        }
        else {
LAB_0016980b:
          uVar22 = 3;
          local_d8 = 99999999;
        }
      }
      else {
        pUVar8 = ms->chainTable;
        uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        uVar14 = (ms->window).lowLimit;
        uVar33 = iVar17 - (int)pBVar28;
        uVar12 = uVar33 - uVar21;
        if (uVar33 < uVar21) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar19,4);
        if (uVar11 <= uVar14) goto LAB_0016980b;
        iVar17 = 1 << ((byte)uVar7 & 0x1f);
        local_d8 = 99999999;
        uVar23 = 3;
        do {
          puVar24 = (ulong *)(pBVar28 + uVar11);
          if (*(char *)(uVar23 + (long)puVar24) == *(char *)((long)puVar19 + uVar23)) {
            puVar20 = puVar19;
            if (puVar19 < puVar1) {
              uVar25 = *puVar19 ^ *puVar24;
              uVar22 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar19) {
                do {
                  puVar20 = puVar20 + 1;
                  puVar24 = puVar24 + 1;
                  if (puVar1 <= puVar20) goto LAB_00169772;
                  uVar25 = *puVar20 ^ *puVar24;
                  uVar22 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (long)puVar20 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar19);
                } while (*puVar24 == *puVar20);
              }
            }
            else {
LAB_00169772:
              if ((puVar20 < puVar2) && ((int)*puVar24 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar24 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar20 < puVar4) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar24 == (char)*puVar20));
              }
              uVar22 = (long)puVar20 - (long)puVar19;
            }
          }
          else {
            uVar22 = 0;
          }
          if ((uVar23 < uVar22) &&
             (local_d8 = (ulong)((uVar33 + 2) - uVar11), uVar23 = uVar22,
             (ulong *)((long)puVar19 + uVar22) == puVar4)) {
            bVar10 = false;
          }
          else {
            uVar22 = uVar23;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar21 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar14 < uVar11)) &&
                (iVar17 = iVar17 + -1, uVar23 = uVar22, iVar17 != 0));
      }
      local_e0 = uVar32;
      if (uVar32 < uVar22) {
        local_e0 = uVar22;
      }
      if (local_e0 < 4) {
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
      }
      else {
        puVar24 = puVar19;
        if (uVar22 <= uVar32) {
          local_d8 = 0;
          puVar24 = (ulong *)((long)puVar19 + 1);
        }
        local_40 = (ulong *)((long)puVar19 + lVar35 + 0xd);
        do {
          if (puVar26 <= puVar19) break;
          puVar20 = (ulong *)((long)puVar19 + 1);
          if (local_d8 == 0) {
            local_d8 = 0;
          }
          else if ((uVar13 != 0) && (*(int *)puVar20 == *(int *)((long)puVar20 + lVar35))) {
            puVar15 = (ulong *)((long)puVar19 + 5);
            puVar18 = (ulong *)((long)puVar19 + lVar35 + 5);
            puVar16 = puVar15;
            if (puVar15 < puVar1) {
              uVar23 = *puVar15 ^ *puVar18;
              uVar32 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
              if (*puVar18 == *puVar15) {
                puVar16 = (ulong *)((long)puVar19 + 0xd);
                puVar18 = local_40;
                do {
                  if (puVar1 <= puVar16) goto LAB_0016995f;
                  uVar23 = *puVar18;
                  uVar22 = *puVar16;
                  uVar25 = uVar22 ^ uVar23;
                  uVar32 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = (long)puVar16 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar15);
                  puVar16 = puVar16 + 1;
                  puVar18 = puVar18 + 1;
                } while (uVar23 == uVar22);
              }
            }
            else {
LAB_0016995f:
              if ((puVar16 < puVar2) && ((int)*puVar18 == (int)*puVar16)) {
                puVar16 = (ulong *)((long)puVar16 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar16 < puVar3) && ((short)*puVar18 == (short)*puVar16)) {
                puVar16 = (ulong *)((long)puVar16 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar16 < puVar4) {
                puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar18 == (char)*puVar16));
              }
              uVar32 = (long)puVar16 - (long)puVar15;
            }
            if (uVar32 < 0xfffffffffffffffc) {
              uVar12 = (int)local_d8 + 1;
              uVar14 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                }
              }
              if ((int)((uVar14 ^ 0x1f) + (int)local_e0 * 3 + -0x1e) < (int)(uVar32 + 4) * 3) {
                local_d8 = 0;
                puVar24 = puVar20;
                local_e0 = uVar32 + 4;
              }
            }
          }
          iVar17 = (int)puVar20;
          if (cParams->searchLength - 6 < 2) {
            pUVar8 = ms->chainTable;
            uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            uVar14 = (ms->window).lowLimit;
            uVar33 = iVar17 - (int)pBVar28;
            uVar12 = uVar33 - uVar21;
            if (uVar33 < uVar21) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar20,6);
            if (uVar11 <= uVar14) goto LAB_00169ed8;
            iVar17 = 1 << ((byte)uVar7 & 0x1f);
            uVar23 = 99999999;
            uVar32 = 3;
            do {
              puVar15 = (ulong *)(pBVar28 + uVar11);
              if (*(char *)(uVar32 + (long)puVar15) == *(char *)((long)puVar20 + uVar32)) {
                puVar16 = puVar20;
                if (puVar20 < puVar1) {
                  uVar25 = *puVar20 ^ *puVar15;
                  uVar22 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar19 + 9);
                  if (*puVar15 == *puVar20) {
                    do {
                      puVar15 = puVar15 + 1;
                      if (puVar1 <= puVar16) goto LAB_00169af2;
                      uVar25 = *puVar16;
                      uVar30 = uVar25 ^ *puVar15;
                      uVar22 = 0;
                      if (uVar30 != 0) {
                        for (; (uVar30 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar22 = (long)puVar16 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar20);
                      puVar16 = puVar16 + 1;
                    } while (*puVar15 == uVar25);
                  }
                }
                else {
LAB_00169af2:
                  if ((puVar16 < puVar2) && ((int)*puVar15 == (int)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar15 = (ulong *)((long)puVar15 + 4);
                  }
                  if ((puVar16 < puVar3) && ((short)*puVar15 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar15 = (ulong *)((long)puVar15 + 2);
                  }
                  if (puVar16 < puVar4) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar15 == (char)*puVar16));
                  }
                  uVar22 = (long)puVar16 - (long)puVar20;
                }
              }
              else {
                uVar22 = 0;
              }
              if ((uVar32 < uVar22) &&
                 (uVar23 = (ulong)((uVar33 + 2) - uVar11), uVar32 = uVar22,
                 (ulong *)((long)puVar20 + uVar22) == puVar4)) {
                bVar10 = false;
              }
              else {
                uVar22 = uVar32;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar21 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar14 < uVar11)) &&
                    (iVar17 = iVar17 + -1, uVar32 = uVar22, iVar17 != 0));
          }
          else if (cParams->searchLength == 5) {
            pUVar8 = ms->chainTable;
            uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            uVar14 = (ms->window).lowLimit;
            uVar33 = iVar17 - (int)pBVar28;
            uVar12 = uVar33 - uVar21;
            if (uVar33 < uVar21) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar20,5);
            if (uVar14 < uVar11) {
              iVar17 = 1 << ((byte)uVar7 & 0x1f);
              uVar23 = 99999999;
              uVar32 = 3;
              do {
                puVar15 = (ulong *)(pBVar28 + uVar11);
                if (*(char *)(uVar32 + (long)puVar15) == *(char *)((long)puVar20 + uVar32)) {
                  puVar16 = puVar20;
                  if (puVar20 < puVar1) {
                    uVar25 = *puVar20 ^ *puVar15;
                    uVar22 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = uVar22 >> 3 & 0x1fffffff;
                    puVar16 = (ulong *)((long)puVar19 + 9);
                    if (*puVar15 == *puVar20) {
                      do {
                        puVar15 = puVar15 + 1;
                        if (puVar1 <= puVar16) goto LAB_00169c9d;
                        uVar25 = *puVar16;
                        uVar30 = uVar25 ^ *puVar15;
                        uVar22 = 0;
                        if (uVar30 != 0) {
                          for (; (uVar30 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        uVar22 = (long)puVar16 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar20);
                        puVar16 = puVar16 + 1;
                      } while (*puVar15 == uVar25);
                    }
                  }
                  else {
LAB_00169c9d:
                    if ((puVar16 < puVar2) && ((int)*puVar15 == (int)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar15 = (ulong *)((long)puVar15 + 4);
                    }
                    if ((puVar16 < puVar3) && ((short)*puVar15 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar15 = (ulong *)((long)puVar15 + 2);
                    }
                    if (puVar16 < puVar4) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar15 == (char)*puVar16))
                      ;
                    }
                    uVar22 = (long)puVar16 - (long)puVar20;
                  }
                }
                else {
                  uVar22 = 0;
                }
                if ((uVar32 < uVar22) &&
                   (uVar23 = (ulong)((uVar33 + 2) - uVar11), uVar32 = uVar22,
                   (ulong *)((long)puVar20 + uVar22) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  uVar22 = uVar32;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar21 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar14 < uVar11)) &&
                      (iVar17 = iVar17 + -1, uVar32 = uVar22, iVar17 != 0));
            }
            else {
LAB_00169ed8:
              uVar22 = 3;
              uVar23 = 99999999;
            }
          }
          else {
            pUVar8 = ms->chainTable;
            uVar21 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            uVar14 = (ms->window).lowLimit;
            uVar33 = iVar17 - (int)pBVar28;
            uVar12 = uVar33 - uVar21;
            if (uVar33 < uVar21) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar20,4);
            if (uVar11 <= uVar14) goto LAB_00169ed8;
            iVar17 = 1 << ((byte)uVar7 & 0x1f);
            uVar23 = 99999999;
            uVar32 = 3;
            do {
              puVar15 = (ulong *)(pBVar28 + uVar11);
              if (*(char *)(uVar32 + (long)puVar15) == *(char *)((long)puVar20 + uVar32)) {
                puVar16 = puVar20;
                if (puVar20 < puVar1) {
                  uVar25 = *puVar20 ^ *puVar15;
                  uVar22 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar19 + 9);
                  if (*puVar15 == *puVar20) {
                    do {
                      puVar15 = puVar15 + 1;
                      if (puVar1 <= puVar16) goto LAB_00169e40;
                      uVar25 = *puVar16;
                      uVar30 = uVar25 ^ *puVar15;
                      uVar22 = 0;
                      if (uVar30 != 0) {
                        for (; (uVar30 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar22 = (long)puVar16 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar20);
                      puVar16 = puVar16 + 1;
                    } while (*puVar15 == uVar25);
                  }
                }
                else {
LAB_00169e40:
                  if ((puVar16 < puVar2) && ((int)*puVar15 == (int)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar15 = (ulong *)((long)puVar15 + 4);
                  }
                  if ((puVar16 < puVar3) && ((short)*puVar15 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar15 = (ulong *)((long)puVar15 + 2);
                  }
                  if (puVar16 < puVar4) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar15 == (char)*puVar16));
                  }
                  uVar22 = (long)puVar16 - (long)puVar20;
                }
              }
              else {
                uVar22 = 0;
              }
              if ((uVar32 < uVar22) &&
                 (uVar23 = (ulong)((uVar33 + 2) - uVar11), uVar32 = uVar22,
                 (ulong *)((long)puVar20 + uVar22) == puVar4)) {
                bVar10 = false;
              }
              else {
                uVar22 = uVar32;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar21 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar14 < uVar11)) &&
                    (iVar17 = iVar17 + -1, uVar32 = uVar22, iVar17 != 0));
          }
          bVar10 = true;
          if (3 < uVar22) {
            uVar12 = (int)local_d8 + 1;
            uVar14 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar12 = (int)uVar23 + 1;
            iVar17 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> iVar17 == 0; iVar17 = iVar17 + -1) {
              }
            }
            if ((int)((uVar14 ^ 0x1f) + (int)local_e0 * 4 + -0x1b) < (int)uVar22 * 4 - iVar17) {
              bVar10 = false;
              puVar24 = puVar20;
              local_d8 = uVar23;
              local_e0 = uVar22;
            }
          }
          local_40 = (ulong *)((long)local_40 + 1);
          puVar19 = puVar20;
        } while (!bVar10);
        if (local_d8 == 0) {
          UVar34 = 1;
        }
        else {
          if ((src < puVar24) && (pBVar31 < (BYTE *)((long)puVar24 + (2 - local_d8)))) {
            puVar19 = puVar24;
            while (puVar24 = puVar19,
                  *(char *)((long)puVar19 - 1) == *(char *)((long)puVar19 + (1 - local_d8))) {
              puVar24 = (ulong *)((long)puVar19 - 1);
              local_e0 = local_e0 + 1;
              if ((puVar24 <= src) ||
                 (pBVar28 = (BYTE *)((long)puVar19 + (1 - local_d8)), puVar19 = puVar24,
                 pBVar28 <= pBVar31)) break;
            }
          }
          uVar29 = (ulong)((int)local_d8 - 2);
          UVar34 = (int)local_d8 + 1;
          local_b4 = uVar13;
        }
        uVar32 = (long)puVar24 - (long)src;
        puVar20 = (ulong *)seqStore->lit;
        puVar19 = (ulong *)((long)puVar20 + uVar32);
        do {
          *puVar20 = *src;
          puVar20 = puVar20 + 1;
          src = (void *)((long)src + 8);
        } while (puVar20 < puVar19);
        seqStore->lit = seqStore->lit + uVar32;
        if (0xffff < uVar32) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9 = seqStore->sequences;
        psVar9->litLength = (U16)uVar32;
        psVar9->offset = UVar34;
        if (0xffff < local_e0 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9->matchLength = (U16)(local_e0 - 3);
        seqStore->sequences = psVar9 + 1;
        src = (void *)((long)puVar24 + local_e0);
        puVar19 = (ulong *)src;
        if ((local_b4 != 0) && (src <= puVar26)) {
          while( true ) {
            uVar32 = (ulong)local_b4;
            uVar13 = (uint)uVar29;
            puVar19 = (ulong *)src;
            if ((int)*src != *(int *)((long)src - uVar32)) break;
            puVar19 = (ulong *)((long)src + 4);
            puVar20 = (ulong *)((long)src + (4 - uVar32));
            puVar24 = puVar19;
            if (puVar19 < puVar1) {
              uVar23 = *puVar19 ^ *puVar20;
              uVar29 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar20 == *puVar19) {
                puVar24 = (ulong *)((long)src + 0xc);
                puVar20 = (ulong *)((long)src + (0xc - uVar32));
                do {
                  if (puVar1 <= puVar24) goto LAB_0016a13e;
                  uVar23 = *puVar20;
                  uVar22 = *puVar24;
                  uVar25 = uVar22 ^ uVar23;
                  uVar29 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar24 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19);
                  puVar24 = puVar24 + 1;
                  puVar20 = puVar20 + 1;
                } while (uVar23 == uVar22);
              }
            }
            else {
LAB_0016a13e:
              if ((puVar24 < puVar2) && ((int)*puVar20 == (int)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 4);
                puVar20 = (ulong *)((long)puVar20 + 4);
              }
              if ((puVar24 < puVar3) && ((short)*puVar20 == (short)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 2);
                puVar20 = (ulong *)((long)puVar20 + 2);
              }
              if (puVar24 < puVar4) {
                puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar20 == (char)*puVar24));
              }
              uVar29 = (long)puVar24 - (long)puVar19;
            }
            *(ulong *)seqStore->lit = *src;
            psVar9 = seqStore->sequences;
            psVar9->litLength = 0;
            psVar9->offset = 1;
            if (0xffff < uVar29 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar9->matchLength = (U16)(uVar29 + 1);
            seqStore->sequences = psVar9 + 1;
            src = (void *)((long)src + uVar29 + 4);
            uVar29 = uVar32;
            puVar19 = (ulong *)src;
            local_b4 = uVar13;
            if ((uVar13 == 0) || (puVar26 < src)) break;
          }
        }
      }
      uVar13 = (uint)uVar29;
    } while (puVar19 < puVar26);
  }
  uVar14 = 0;
  if (uVar27 < uVar5) {
    uVar14 = uVar5;
  }
  if (uVar27 < uVar6) {
    uVar14 = uVar6;
  }
  if (uVar13 == 0) {
    uVar13 = uVar14;
  }
  if (local_b4 != 0) {
    uVar14 = local_b4;
  }
  *rep = uVar13;
  rep[1] = uVar14;
  return (long)puVar4 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}